

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

void stbi__hdr_convert(float *output,stbi_uc *input,int req_comp)

{
  double dVar1;
  float fVar2;
  
  if (input[3] == 0) {
    output[0] = 0.0;
    output[1] = 0.0;
    fVar2 = 0.0;
  }
  else {
    dVar1 = ldexp(1.0,input[3] - 0x88);
    fVar2 = (float)dVar1;
    *output = (float)*input * fVar2;
    output[1] = (float)input[1] * fVar2;
    fVar2 = (float)input[2] * fVar2;
  }
  output[3] = 1.0;
  output[2] = fVar2;
  return;
}

Assistant:

static void stbi__hdr_convert(float *output, stbi_uc *input, int req_comp)
{
   if ( input[3] != 0 ) {
      float f1;
      // Exponent
      f1 = (float) ldexp(1.0f, input[3] - (int)(128 + 8));
      if (req_comp <= 2)
         output[0] = (input[0] + input[1] + input[2]) * f1 / 3;
      else {
         output[0] = input[0] * f1;
         output[1] = input[1] * f1;
         output[2] = input[2] * f1;
      }
      if (req_comp == 2) output[1] = 1;
      if (req_comp == 4) output[3] = 1;
   } else {
      switch (req_comp) {
         case 4: output[3] = 1; /* fallthrough */
         case 3: output[0] = output[1] = output[2] = 0;
                 break;
         case 2: output[1] = 1; /* fallthrough */
         case 1: output[0] = 0;
                 break;
      }
   }
}